

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void arena_postfork_parent(tsdn_t *tsdn,arena_t *arena)

{
  tsdn_t *in_RSI;
  uint j;
  uint i;
  uint in_stack_ffffffffffffffe8;
  uint uVar1;
  
  for (uVar1 = 0; uVar1 < 0x24; uVar1 = uVar1 + 1) {
    for (in_stack_ffffffffffffffe8 = 0; in_stack_ffffffffffffffe8 < bin_infos[uVar1].n_shards;
        in_stack_ffffffffffffffe8 = in_stack_ffffffffffffffe8 + 1) {
      bin_postfork_parent(in_RSI,(bin_t *)CONCAT44(uVar1,in_stack_ffffffffffffffe8));
    }
  }
  malloc_mutex_postfork_parent(in_RSI,(malloc_mutex_t *)CONCAT44(uVar1,in_stack_ffffffffffffffe8));
  base_postfork_parent(in_RSI,(base_t *)CONCAT44(uVar1,in_stack_ffffffffffffffe8));
  malloc_mutex_postfork_parent(in_RSI,(malloc_mutex_t *)CONCAT44(uVar1,in_stack_ffffffffffffffe8));
  extents_postfork_parent(in_RSI,(extents_t *)CONCAT44(uVar1,in_stack_ffffffffffffffe8));
  extents_postfork_parent(in_RSI,(extents_t *)CONCAT44(uVar1,in_stack_ffffffffffffffe8));
  extents_postfork_parent(in_RSI,(extents_t *)CONCAT44(uVar1,in_stack_ffffffffffffffe8));
  malloc_mutex_postfork_parent(in_RSI,(malloc_mutex_t *)CONCAT44(uVar1,in_stack_ffffffffffffffe8));
  malloc_mutex_postfork_parent(in_RSI,(malloc_mutex_t *)CONCAT44(uVar1,in_stack_ffffffffffffffe8));
  malloc_mutex_postfork_parent(in_RSI,(malloc_mutex_t *)CONCAT44(uVar1,in_stack_ffffffffffffffe8));
  malloc_mutex_postfork_parent(in_RSI,(malloc_mutex_t *)CONCAT44(uVar1,in_stack_ffffffffffffffe8));
  return;
}

Assistant:

void
arena_postfork_parent(tsdn_t *tsdn, arena_t *arena) {
	unsigned i;

	for (i = 0; i < SC_NBINS; i++) {
		for (unsigned j = 0; j < bin_infos[i].n_shards; j++) {
			bin_postfork_parent(tsdn,
			    &arena->bins[i].bin_shards[j]);
		}
	}
	malloc_mutex_postfork_parent(tsdn, &arena->large_mtx);
	base_postfork_parent(tsdn, arena->base);
	malloc_mutex_postfork_parent(tsdn, &arena->extent_avail_mtx);
	extents_postfork_parent(tsdn, &arena->extents_dirty);
	extents_postfork_parent(tsdn, &arena->extents_muzzy);
	extents_postfork_parent(tsdn, &arena->extents_retained);
	malloc_mutex_postfork_parent(tsdn, &arena->extent_grow_mtx);
	malloc_mutex_postfork_parent(tsdn, &arena->decay_dirty.mtx);
	malloc_mutex_postfork_parent(tsdn, &arena->decay_muzzy.mtx);
	if (config_stats) {
		malloc_mutex_postfork_parent(tsdn, &arena->tcache_ql_mtx);
	}
}